

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::addAttachments(QPDFJob *this,QPDF *pdf)

{
  bool bVar1;
  element_type *peVar2;
  QPDFEFStreamObjectHelper *this_00;
  ulong uVar3;
  runtime_error *this_01;
  bool local_269;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  reference local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string message;
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_188;
  allocator<char> local_161;
  string local_160 [32];
  undefined1 local_140 [24];
  QPDFEFStreamObjectHelper efs;
  QPDFFileSpecObjectHelper fs;
  reference local_a8;
  AddAttachment *to_add;
  iterator __end1;
  iterator __begin1;
  list<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  duplicated_keys;
  QPDFEmbeddedFileDocumentHelper efdh;
  allocator<char> local_39;
  string local_38;
  QPDF *local_18;
  QPDF *pdf_local;
  QPDFJob *this_local;
  
  local_18 = pdf;
  pdf_local = (QPDF *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"/UseAttachments",&local_39);
  maybe_set_pagemode(pdf,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper
            ((QPDFEmbeddedFileDocumentHelper *)
             &duplicated_keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  __end1 = std::__cxx11::list<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_>::
           begin(&peVar2->attachments_to_add);
  to_add = (AddAttachment *)
           std::__cxx11::list<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_>::end
                     (&peVar2->attachments_to_add);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&to_add), bVar1) {
    local_a8 = std::_List_iterator<QPDFJob::AddAttachment>::operator*(&__end1);
    local_269 = false;
    if ((local_a8->replace & 1U) == 0) {
      QPDFEmbeddedFileDocumentHelper::getEmbeddedFile
                ((QPDFEmbeddedFileDocumentHelper *)&stack0xffffffffffffff48,
                 (string *)
                 &duplicated_keys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_269 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffff48)
      ;
      std::shared_ptr<QPDFFileSpecObjectHelper>::~shared_ptr
                ((shared_ptr<QPDFFileSpecObjectHelper> *)&stack0xffffffffffffff48);
    }
    if (local_269 == false) {
      QPDFFileSpecObjectHelper::createFileSpec
                ((QPDFFileSpecObjectHelper *)
                 &efs.m.
                  super___shared_ptr<QPDFEFStreamObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,local_18,&local_a8->filename,&local_a8->path);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        QPDFFileSpecObjectHelper::setDescription
                  ((QPDFFileSpecObjectHelper *)
                   &efs.m.
                    super___shared_ptr<QPDFEFStreamObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,&local_a8->description);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_160,"",&local_161);
      QPDFFileSpecObjectHelper::getEmbeddedFileStream
                ((QPDFFileSpecObjectHelper *)local_140,
                 (string *)
                 &efs.m.
                  super___shared_ptr<QPDFEFStreamObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      QPDFEFStreamObjectHelper::QPDFEFStreamObjectHelper
                ((QPDFEFStreamObjectHelper *)(local_140 + 0x10),(QPDFObjectHandle *)local_140);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_140);
      std::__cxx11::string::~string(local_160);
      std::allocator<char>::~allocator(&local_161);
      this_00 = QPDFEFStreamObjectHelper::setCreationDate
                          ((QPDFEFStreamObjectHelper *)(local_140 + 0x10),&local_a8->creationdate);
      QPDFEFStreamObjectHelper::setModDate(this_00,&local_a8->moddate);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        QPDFEFStreamObjectHelper::setSubtype
                  ((QPDFEFStreamObjectHelper *)(local_140 + 0x10),&local_a8->mimetype);
      }
      QPDFEmbeddedFileDocumentHelper::replaceEmbeddedFile
                ((QPDFEmbeddedFileDocumentHelper *)
                 &duplicated_keys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_a8->key,
                 (QPDFFileSpecObjectHelper *)
                 &efs.m.
                  super___shared_ptr<QPDFEFStreamObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      message.field_2._8_8_ = local_a8;
      std::function<void(Pipeline&,std::__cxx11::string_const&)>::
      function<QPDFJob::addAttachments(QPDF&)::__0,void>
                ((function<void(Pipeline&,std::__cxx11::string_const&)> *)&local_188,
                 (anon_class_8_1_6d5ef21b *)((long)&message.field_2 + 8));
      doIfVerbose(this,&local_188);
      std::
      function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_188);
      QPDFEFStreamObjectHelper::~QPDFEFStreamObjectHelper
                ((QPDFEFStreamObjectHelper *)(local_140 + 0x10));
      QPDFFileSpecObjectHelper::~QPDFFileSpecObjectHelper
                ((QPDFFileSpecObjectHelper *)
                 &efs.m.
                  super___shared_ptr<QPDFEFStreamObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1,&local_a8->key);
    }
    std::_List_iterator<QPDFJob::AddAttachment>::operator++(&__end1);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&__range2);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1);
    k = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&k), bVar1) {
      local_1d0 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)&__range2,", ");
      }
      std::__cxx11::string::operator+=((string *)&__range2,(string *)local_1d0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    QPDF::getFilename_abi_cxx11_(&local_250,local_18);
    std::operator+(&local_230,&local_250," already has attachments with the following keys: ");
    std::operator+(&local_210,&local_230,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2);
    std::operator+(&local_1f0,&local_210,
                   "; use --replace to replace or --key to specify a different key");
    std::__cxx11::string::operator=((string *)&__range2,(string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,(string *)&__range2);
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  QPDFEmbeddedFileDocumentHelper::~QPDFEmbeddedFileDocumentHelper
            ((QPDFEmbeddedFileDocumentHelper *)
             &duplicated_keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void
QPDFJob::addAttachments(QPDF& pdf)
{
    maybe_set_pagemode(pdf, "/UseAttachments");
    QPDFEmbeddedFileDocumentHelper efdh(pdf);
    std::vector<std::string> duplicated_keys;
    for (auto const& to_add: m->attachments_to_add) {
        if ((!to_add.replace) && efdh.getEmbeddedFile(to_add.key)) {
            duplicated_keys.push_back(to_add.key);
            continue;
        }

        auto fs = QPDFFileSpecObjectHelper::createFileSpec(pdf, to_add.filename, to_add.path);
        if (!to_add.description.empty()) {
            fs.setDescription(to_add.description);
        }
        auto efs = QPDFEFStreamObjectHelper(fs.getEmbeddedFileStream());
        efs.setCreationDate(to_add.creationdate).setModDate(to_add.moddate);
        if (!to_add.mimetype.empty()) {
            efs.setSubtype(to_add.mimetype);
        }

        efdh.replaceEmbeddedFile(to_add.key, fs);
        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << prefix << ": attached " << to_add.path << " as " << to_add.filename << " with key "
              << to_add.key << "\n";
        });
    }

    if (!duplicated_keys.empty()) {
        std::string message;
        for (auto const& k: duplicated_keys) {
            if (!message.empty()) {
                message += ", ";
            }
            message += k;
        }
        message = pdf.getFilename() +
            " already has attachments with the following keys: " + message +
            "; use --replace to replace or --key to specify a different key";
        throw std::runtime_error(message);
    }
}